

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_mutex.hpp
# Opt level: O3

bool __thiscall
yamc::fair::recursive_timed_mutex::
try_lock_until<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (recursive_timed_mutex *this,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp)

{
  bool bVar1;
  pthread_t pVar2;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_30;
  
  pVar2 = pthread_self();
  local_30._M_device = (mutex_type *)(this + 0x60);
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  if (*(pthread_t *)(this + 8) == pVar2) {
    if (*(long *)this == 0) {
      __assert_fail("0 < ncount_",
                    "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/fair_mutex.hpp"
                    ,0x177,
                    "bool yamc::fair::recursive_timed_mutex::try_lock_until(const std::chrono::time_point<Clock, Duration> &) [Clock = std::chrono::system_clock, Duration = std::chrono::duration<long, std::ratio<1, 1000000000>>]"
                   );
    }
    *(long *)this = *(long *)this + 1;
  }
  else {
    bVar1 = detail::timed_mutex_impl::
            impl_try_lockwait<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                      ((timed_mutex_impl *)(this + 0x10),&local_30,tp);
    if (!bVar1) {
      bVar1 = false;
      goto LAB_001ec1d0;
    }
    *(undefined8 *)this = 1;
    *(pthread_t *)(this + 8) = pVar2;
  }
  bVar1 = true;
LAB_001ec1d0:
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return bVar1;
}

Assistant:

bool try_lock_until(const std::chrono::time_point<Clock, Duration>& tp)
  {
    const auto tid = std::this_thread::get_id();
    auto lk = impl_.internal_lock();
    if (owner_ == tid) {
      assert(0 < ncount_);
      ++ncount_;
      return true;
    }
    if (!impl_.impl_try_lockwait(lk, tp))
      return false;
    ncount_ = 1;
    owner_ = tid;
    return true;
  }